

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::default_cost_type<float>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<float> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  float fVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  pointer ppVar5;
  uint uVar6;
  pointer ppVar7;
  pointer ppVar8;
  undefined8 extraout_RAX;
  int i;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  pointer ppVar12;
  float *pfVar13;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_float>
  __aurng;
  long lVar14;
  pointer ppVar15;
  float fVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> r;
  allocator_type local_61;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_60;
  uint local_44;
  default_cost_type<float> *local_40;
  ulong local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  uVar4 = (ulong)(uint)n;
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            (&local_60,(long)n,&local_61);
  ppVar8 = local_60.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = local_60.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (n != 0) {
    pfVar2 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    uVar10 = 0;
    do {
      local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar10].first = pfVar2[uVar10];
      local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar10].second = (int)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  ppVar12 = local_60.
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar6 = n;
  local_40 = this;
  if (local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_44 = n;
    local_38 = uVar4;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_60.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_60.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_60.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_60.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar5,ppVar8);
    ppVar5 = local_60.
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar12 = local_60.
              super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVar8 = local_60.
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = local_44;
    uVar4 = local_38;
  }
  for (; ppVar7 = local_60.
                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, local_44 = uVar6, local_38 = uVar4,
      ppVar5 != local_60.
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish; ppVar5 = ppVar5 + 1) {
    fVar1 = ppVar5->first;
    fVar16 = ppVar12->first;
    if (((fVar1 != fVar16) ||
        (ppVar15 = ppVar12,
        local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppVar8, NAN(fVar1) || NAN(fVar16))) &&
       (ppVar15 = ppVar5,
       local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
       _M_impl.super__Vector_impl_data._M_finish = ppVar8, 8 < (long)ppVar5 - (long)ppVar12)) {
      do {
        auVar17._0_4_ =
             std::
             generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (rng);
        auVar17._4_60_ = extraout_var;
        auVar3 = vfmadd213ss_fma(auVar17._0_16_,ZEXT416((uint)(fVar1 - fVar16)),
                                 ZEXT416((uint)fVar16));
        ppVar12->first = auVar3._0_4_;
        ppVar12 = ppVar12 + 1;
      } while (ppVar12 != ppVar5);
    }
    ppVar12 = ppVar15;
    ppVar8 = local_60.
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = local_44;
    uVar4 = local_38;
    local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar7;
  }
  if (8 < (long)local_60.
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppVar12) {
    if ((long)ppVar12 -
        (long)local_60.
              super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      fVar1 = ppVar12->first;
      fVar16 = fVar1 + 1.0;
      if ((fVar1 == fVar16) && (!NAN(fVar1) && !NAN(fVar16))) goto LAB_00148c04;
      if (ppVar12 !=
          local_60.
          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppVar8;
        do {
          auVar19._0_4_ =
               std::
               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar19._4_60_ = extraout_var_01;
          auVar3 = vfmadd213ss_fma(auVar19._0_16_,ZEXT416((uint)(fVar16 - fVar1)),
                                   ZEXT416((uint)fVar1));
          ppVar12->first = auVar3._0_4_;
          ppVar12 = ppVar12 + 1;
          ppVar8 = local_60.
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar12 != ppVar7);
      }
    }
    else {
      local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppVar8;
      fVar16 = linearize<long,float>
                         (0,(local_60.
                             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first,
                          (long)ppVar12 -
                          (long)local_60.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3,ppVar12->first,
                          (long)ppVar8 -
                          (long)local_60.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
      fVar1 = ppVar12->first;
      if ((fVar1 == fVar16) && (!NAN(fVar1) && !NAN(fVar16))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_00148c04:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_60.
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      ppVar8 = local_60.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar12 != ppVar7) {
        do {
          auVar18._0_4_ =
               std::
               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar18._4_60_ = extraout_var_00;
          auVar3 = vfmadd213ss_fma(auVar18._0_16_,ZEXT416((uint)(fVar16 - fVar1)),
                                   ZEXT416((uint)fVar1));
          ppVar12->first = auVar3._0_4_;
          ppVar12 = ppVar12 + 1;
          ppVar8 = local_60.
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar12 != ppVar7);
      }
    }
  }
  local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar8;
  ppVar5 = local_60.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_60.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_60.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_60.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_60.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar5,local_60.
                      super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (uVar6 != 0) {
    pfVar2 = (local_40->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    uVar10 = 0;
    do {
      pfVar2[uVar10] =
           local_60.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar10].first;
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  pfVar2 = (local_40->linear_elements)._M_t.
           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  pfVar11 = pfVar2;
  if (1 < uVar6) {
    lVar14 = (long)n * 4 + -4;
    pfVar13 = pfVar2;
    pfVar9 = pfVar2;
    do {
      pfVar9 = pfVar9 + 1;
      pfVar11 = pfVar9;
      if (*pfVar9 <= *pfVar13) {
        pfVar11 = pfVar13;
      }
      lVar14 = lVar14 + -4;
      pfVar13 = pfVar11;
    } while (lVar14 != 0);
  }
  fVar1 = *pfVar11;
  if (uVar6 != 0 && (int)ABS(fVar1) - 0x800000U < 0x7f000000) {
    uVar10 = 0;
    do {
      pfVar2[uVar10] = pfVar2[uVar10] / fVar1;
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  if (local_60.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }